

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  long lVar1;
  pointer pbVar2;
  __type_conflict1 _Var3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0;
  uVar5 = 0;
  do {
    pbVar2 = (this->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
    if (uVar4 <= uVar5) {
LAB_003d372a:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return uVar5 < uVar4;
      }
      __stack_chk_fail();
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar2->_M_dataplus)._M_p + lVar6),key);
    if (_Var3) {
      *retIdx = uVar5;
      goto LAB_003d372a;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x20;
  } while( true );
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}